

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

OperatingState __thiscall helics::CommonCore::minFederateState(CommonCore *this)

{
  int iVar1;
  OperatingState OVar2;
  byte bVar3;
  uint uVar4;
  FedInfo **ppFVar5;
  ulong uVar6;
  FedInfo *fed;
  FedInfo *pFVar7;
  uint uVar8;
  FedInfo **ppFVar9;
  uint uVar10;
  long lVar11;
  FedInfo **ppFVar12;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar6 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar5 = (this->loopFederates).dataStorage.dataptr;
    if (uVar6 != 0x20) {
      ppFVar5 = ppFVar5 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar7 = *ppFVar5 + uVar6;
      goto LAB_002f90ce;
    }
    if (ppFVar5 == (FedInfo **)0x0) {
      ppFVar5 = &gmlc::containers::
                 StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                 emptyValue;
    }
    else {
      ppFVar5 = ppFVar5 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar5 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar7 = *ppFVar5;
  uVar6 = 0;
LAB_002f90ce:
  uVar4 = (this->loopFederates).dataStorage.bsize;
  ppFVar9 = (this->loopFederates).dataStorage.dataptr;
  lVar11 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar9 == (FedInfo **)0x0) {
    ppFVar12 = &gmlc::containers::
                StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                emptyValue;
  }
  else {
    ppFVar12 = ppFVar9 + lVar11 + 1;
  }
  uVar8 = 0;
  if (uVar4 != 0x20) {
    uVar8 = uVar4;
  }
  ppFVar9 = ppFVar9 + lVar11;
  if (uVar4 == 0x20) {
    ppFVar9 = ppFVar12;
  }
  if (((uint)uVar6 != uVar8) || (OVar2 = DISCONNECTED, ppFVar5 != ppFVar9)) {
    uVar4 = 10;
    do {
      bVar3 = (byte)uVar4;
      uVar4 = uVar4 & 0xff;
      if ((byte)*(uint *)&pFVar7->state < bVar3) {
        uVar4 = *(uint *)&pFVar7->state;
      }
      OVar2 = (OperatingState)uVar4;
      iVar1 = (int)uVar6;
      uVar10 = iVar1 + 1;
      if (iVar1 < 0x1f) {
        pFVar7 = pFVar7 + 1;
      }
      else {
        ppFVar5 = ppFVar5 + (ulong)(iVar1 - 0x1fU >> 5) + 1;
        uVar10 = uVar10 & 0x1f;
        pFVar7 = (FedInfo *)((long)&(*ppFVar5)->fed + (ulong)(uVar10 << 4));
      }
      uVar6 = (ulong)uVar10;
    } while ((uVar10 != uVar8) || (ppFVar5 != ppFVar9));
  }
  return OVar2;
}

Assistant:

const_iterator begin() const
        {
            if (csize == 0) {
                return end();
            }
            const X* const* ptr = dataptr;
            return {ptr, 0};
        }